

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLimit::ChLinkLimit(ChLinkLimit *this,ChLinkLimit *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->constr_upper);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->constr_lower);
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar8 = other->m_penalty_only;
  bVar9 = other->m_polar;
  bVar10 = other->m_rotation;
  this->m_active = other->m_active;
  this->m_penalty_only = bVar8;
  this->m_polar = bVar9;
  this->m_rotation = bVar10;
  dVar1 = other->m_min;
  dVar2 = other->m_maxCushion;
  dVar3 = other->m_minCushion;
  dVar4 = other->m_Kmax;
  dVar5 = other->m_Kmin;
  dVar6 = other->m_Rmax;
  dVar7 = other->m_Rmin;
  this->m_max = other->m_max;
  this->m_min = dVar1;
  this->m_maxCushion = dVar2;
  this->m_minCushion = dVar3;
  this->m_Kmax = dVar4;
  this->m_Kmin = dVar5;
  this->m_Rmax = dVar6;
  this->m_Rmin = dVar7;
  dVar1 = other->m_minElastic;
  this->m_maxElastic = other->m_maxElastic;
  this->m_minElastic = dVar1;
  iVar11 = (*((other->m_Kmax_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var,iVar11));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Kmax_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar11 = (*((other->m_Kmin_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_00,iVar11));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Kmin_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar11 = (*((other->m_Rmax_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_01,iVar11));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Rmax_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar11 = (*((other->m_Rmin_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_02,iVar11));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Rmin_modul).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar11 = (*((other->m_polarMax_funct).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_03,iVar11));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_polarMax_funct).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChLinkLimit::ChLinkLimit(const ChLinkLimit& other) {
    m_active = other.m_active;
    m_penalty_only = other.m_penalty_only;
    m_polar = other.m_polar;
    m_rotation = other.m_rotation;

    m_max = other.m_max;
    m_min = other.m_min;
    m_maxCushion = other.m_maxCushion;
    m_minCushion = other.m_minCushion;
    m_Kmax = other.m_Kmax;
    m_Kmin = other.m_Kmin;
    m_Rmax = other.m_Rmax;
    m_Rmin = other.m_Rmin;
    m_minElastic = other.m_minElastic;
    m_maxElastic = other.m_maxElastic;

    m_Kmax_modul = std::shared_ptr<ChFunction>(other.m_Kmax_modul->Clone());
    m_Kmin_modul = std::shared_ptr<ChFunction>(other.m_Kmin_modul->Clone());
    m_Rmax_modul = std::shared_ptr<ChFunction>(other.m_Rmax_modul->Clone());
    m_Rmin_modul = std::shared_ptr<ChFunction>(other.m_Rmin_modul->Clone());
    m_polarMax_funct = std::shared_ptr<ChFunction>(other.m_polarMax_funct->Clone());
}